

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_traits.c
# Opt level: O3

mpt_type_traits * mpt_type_traits(mpt_type_t type)

{
  mpt_type_traits *pmVar1;
  mpt_named_traits *pmVar2;
  long lVar3;
  generic_traits_chunk *pgVar4;
  uint uVar5;
  ulong uVar6;
  
  if (type == 0) {
LAB_0011c399:
    pmVar1 = (mpt_type_traits *)0x0;
  }
  else {
    if (type < 0x20) {
      if (core_types == (mpt_type_traits *)0x0) {
        pmVar1 = (mpt_type_traits *)calloc(0x18,0x20);
        lVar3 = 0;
        core_types = pmVar1;
        do {
          pmVar1[core_sizes[lVar3].type].size = (ulong)core_sizes[lVar3].size;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        atexit(_core_fini);
      }
      pmVar1 = core_types + type;
    }
    else if (type - 0x60 < 0x1b) {
      if (scalar_types == (mpt_type_traits *)0x0) {
        pmVar1 = (mpt_type_traits *)calloc(0x18,0x20);
        lVar3 = 0;
        scalar_types = pmVar1;
        do {
          pmVar1[(ulong)scalar_sizes[lVar3].type - 0x60].size = (ulong)scalar_sizes[lVar3].size;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xd);
        atexit(_scalar_fini);
      }
      pmVar1 = scalar_types + (type - 0x60);
    }
    else {
      if (0x19 < type - 0x40) {
        if ((type & 0xffffffffffffffc0) == 0xc0) {
          uVar5 = (int)type - 0xc0;
          if (dynamic_pos <= (int)uVar5) {
            return (mpt_type_traits *)0x0;
          }
          return dynamic_types + uVar5;
        }
        if ((type & 0xffffffffffffffc0) == 0x80) {
          pmVar2 = mpt_interface_traits(type);
        }
        else {
          switch(type) {
          case 0x800:
            pmVar1 = mpt_identifier_traits();
            return pmVar1;
          case 0x801:
            pmVar1 = mpt_meta_reference_traits();
            return pmVar1;
          case 0x802:
            pmVar1 = mpt_array_traits();
            return pmVar1;
          case 0x803:
            pmVar1 = mpt_command_traits();
            return pmVar1;
          }
          if (0x6ff < type - 0x100) {
            if (generic_types != (generic_traits_chunk *)0x0) {
              uVar6 = type - 0x900;
              pgVar4 = generic_types;
              do {
                if (uVar6 < pgVar4->used) {
                  return pgVar4->traits[uVar6];
                }
                uVar6 = uVar6 - 0x1e;
                pgVar4 = pgVar4->next;
              } while (pgVar4 != (generic_traits_chunk *)0x0);
              return (mpt_type_traits *)0x0;
            }
            goto LAB_0011c399;
          }
          pmVar2 = mpt_metatype_traits(type);
        }
        if (pmVar2 != (mpt_named_traits *)0x0) {
          return pmVar2->traits;
        }
        goto LAB_0011c399;
      }
      if (iovec_types == (mpt_type_traits *)0x0) {
        pmVar1 = (mpt_type_traits *)calloc(0x18,0x20);
        lVar3 = 0;
        iovec_types = pmVar1;
        do {
          pmVar1[(ulong)scalar_sizes[lVar3].type - 0x60].size = 0x10;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xd);
        atexit(_iovec_fini);
      }
      pmVar1 = iovec_types + (type - 0x40);
    }
    if (pmVar1->size == 0) {
      pmVar1 = (mpt_type_traits *)0x0;
    }
  }
  return pmVar1;
}

Assistant:

extern const MPT_STRUCT(type_traits) *mpt_type_traits(MPT_TYPE(type) type)
{
	const struct generic_traits_chunk *group;
	
	/* bad type value */
	if (!type) {
		return 0;
	}
	/* builtin scalar types */
	if (type < MPT_ENUM(_TypeCoreSize)) {
		if (!core_types) {
			_core_init();
		}
		return core_types[type].size ? &core_types[type] : 0;
	}
	/* generic/typed vector */
	if (MPT_type_isScalar(type)) {
		if (!scalar_types) {
			_scalar_init();
		}
		type -= MPT_ENUM(_TypeScalarBase);
		return scalar_types[type].size ? &scalar_types[type] : 0;
	}
	/* generic/typed vector */
	if (MPT_type_isVector(type)) {
		if (!iovec_types) {
			_iovec_init();
		}
		type -= MPT_ENUM(_TypeVectorBase);
		return iovec_types[type].size ? &iovec_types[type] : 0;
	}
	/* interface type */
	if (MPT_type_isInterface(type)) {
		const MPT_STRUCT(named_traits) *it = mpt_interface_traits(type);
		return it ? it->traits : 0;
	}
	
	if (MPT_type_isDynamic(type)) {
		int pos = type - MPT_ENUM(_TypeDynamicBase);
		if (pos >= dynamic_pos) {
			return 0;
		}
		return dynamic_types + pos;
	}
	
	switch (type) {
		case MPT_ENUM(TypeIdentifier):
			return mpt_identifier_traits();
		case MPT_ENUM(TypeArray):
			return mpt_array_traits();
		case MPT_ENUM(TypeMetaRef):
			return mpt_meta_reference_traits();
		case MPT_ENUM(TypeCommand):
			return mpt_command_traits();
		default:;
	}
	
	if (MPT_type_isMetaPtr(type)) {
		const MPT_STRUCT(named_traits) *it = mpt_metatype_traits(type);
		return it ? it->traits : 0;
	}
	
	type -= MPT_ENUM(_TypeValueAdd);
	group = generic_types;
	while (group) {
		if (type < group->used) {
			return group->traits[type];
		}
		type -= MPT_arrsize(group->traits);
		group = group->next;
	}
	
	return 0;
}